

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_refine_qualities.cpp
# Opt level: O2

void __thiscall
Omega_h::MetricRefineQualities<3,_1>::MetricRefineQualities
          (MetricRefineQualities<3,_1> *this,Mesh *mesh,LOs *candidates)

{
  allocator local_59;
  undefined1 local_58 [64];
  
  std::__cxx11::string::string((string *)(local_58 + 0x20),"metric",&local_59);
  Omega_h::Mesh::get_array<double>((Mesh *)this,(Int)mesh,(string *)0x0);
  std::__cxx11::string::~string((string *)(local_58 + 0x20));
  Write<int>::Write((Write<int> *)(local_58 + 0x10),&candidates->write_);
  std::__cxx11::string::string((string *)(local_58 + 0x20),"metric",&local_59);
  Omega_h::Mesh::get_array<double>((Mesh *)local_58,(Int)mesh,(string *)0x0);
  get_mident_metrics((Omega_h *)(this + 0x10),mesh,1,(LOs *)(local_58 + 0x10),(Reals *)local_58,
                     false);
  Write<double>::~Write((Write<double> *)local_58);
  std::__cxx11::string::~string((string *)(local_58 + 0x20));
  Write<int>::~Write((Write<int> *)(local_58 + 0x10));
  return;
}

Assistant:

MetricRefineQualities(Mesh* mesh, LOs candidates)
      : vert_metrics(mesh->get_array<Real>(VERT, "metric")),
        /* TODO: we could reuse the results of this instead of recomputing
         * them when transferring an OMEGA_H_METRIC field in transfer.cpp
         */
        midpt_metrics(get_mident_metrics(
            mesh, EDGE, candidates, mesh->get_array<Real>(VERT, "metric"))) {}